

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O0

void do_process(h2o_compress_context_t *_self,h2o_iovec_t *inbufs,size_t inbufcnt,
               h2o_send_state_t state,h2o_iovec_t **outbufs,size_t *outbufcnt,processor proc)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  h2o_iovec_t hVar5;
  char *local_70;
  char *local_68;
  long local_60;
  size_t i;
  h2o_iovec_t last_buf;
  size_t outbufindex;
  st_gzip_context_t *self;
  size_t *outbufcnt_local;
  h2o_iovec_t **outbufs_local;
  h2o_send_state_t state_local;
  size_t inbufcnt_local;
  h2o_iovec_t *inbufs_local;
  h2o_compress_context_t *_self_local;
  
  last_buf.len = 0;
  pcVar1 = _self[6].name.base;
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  if (inbufcnt == 0) {
    hVar5 = h2o_iovec_init((void *)0x0,0);
    local_70 = hVar5.base;
    i = (size_t)local_70;
    local_68 = (char *)hVar5.len;
    last_buf.base = local_68;
  }
  else {
    for (local_60 = 0; local_60 != inbufcnt - 1; local_60 = local_60 + 1) {
      last_buf.len = process_chunk((st_gzip_context_t *)_self,inbufs[local_60].base,
                                   inbufs[local_60].len,0,last_buf.len,proc);
    }
    i = (size_t)inbufs[local_60].base;
    last_buf.base = (char *)inbufs[local_60].len;
  }
  iVar2 = h2o_send_state_is_in_progress(state);
  iVar3 = 4;
  if (iVar2 != 0) {
    iVar3 = 2;
  }
  sVar4 = process_chunk((st_gzip_context_t *)_self,(void *)i,(size_t)last_buf.base,iVar3,
                        last_buf.len,proc);
  *outbufs = (h2o_iovec_t *)_self[6].name.base;
  *outbufcnt = sVar4 + 1;
  iVar3 = h2o_send_state_is_in_progress(state);
  if (iVar3 == 0) {
    if (_self->transform == do_compress) {
      deflateEnd(_self + 1);
    }
    else {
      inflateEnd(_self + 1);
    }
    *(undefined4 *)&_self[5].transform = 0;
  }
  return;
}

Assistant:

static void do_process(h2o_compress_context_t *_self, h2o_iovec_t *inbufs, size_t inbufcnt, h2o_send_state_t state,
                       h2o_iovec_t **outbufs, size_t *outbufcnt, processor proc)
{
    struct st_gzip_context_t *self = (void *)_self;
    size_t outbufindex;
    h2o_iovec_t last_buf;

    outbufindex = 0;
    self->bufs.entries[0].len = 0;

    if (inbufcnt != 0) {
        size_t i;
        for (i = 0; i != inbufcnt - 1; ++i)
            outbufindex = process_chunk(self, inbufs[i].base, inbufs[i].len, Z_NO_FLUSH, outbufindex, proc);
        last_buf = inbufs[i];
    } else {
        last_buf = h2o_iovec_init(NULL, 0);
    }
    outbufindex = process_chunk(self, last_buf.base, last_buf.len, h2o_send_state_is_in_progress(state) ? Z_SYNC_FLUSH : Z_FINISH,
                                outbufindex, proc);

    *outbufs = self->bufs.entries;
    *outbufcnt = outbufindex + 1;

    if (!h2o_send_state_is_in_progress(state)) {
        if (self->super.transform == do_compress) {
            deflateEnd(&self->zs);
        } else {
            inflateEnd(&self->zs);
        }
        self->zs_is_open = 0;
    }
}